

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.cpp
# Opt level: O0

void __thiscall
aeron::Subscription::Subscription
          (Subscription *this,ClientConductor *conductor,int64_t registrationId,string *channel,
          int32_t streamId,int32_t channelStatusId)

{
  ImageList *this_00;
  atomic<aeron::ImageList_*> *this_01;
  string *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  
  *in_RDI = &PTR__Subscription_0022dcc8;
  in_RDI[1] = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RCX);
  *(undefined4 *)(in_RDI + 6) = in_R9D;
  in_RDI[7] = 0;
  in_RDI[8] = in_RDX;
  *(undefined4 *)(in_RDI + 9) = in_R8D;
  this_00 = (ImageList *)operator_new(0x10);
  this_01 = (atomic<aeron::ImageList_*> *)operator_new__(8);
  (this_01->_M_b)._M_p = (__pointer_type)0x0;
  ImageList::ImageList(this_00,(Image *)(this_01 + 1),0);
  std::atomic<aeron::ImageList_*>::atomic
            (this_01,(__pointer_type)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  std::atomic<bool>::atomic((atomic<bool> *)this_01,(bool)in_stack_ffffffffffffff9f);
  return;
}

Assistant:

Subscription::Subscription(
    ClientConductor &conductor,
    std::int64_t registrationId,
    const std::string &channel,
    std::int32_t streamId,
    std::int32_t channelStatusId) :
    m_conductor(conductor),
    m_channel(channel),
    m_channelStatusId(channelStatusId),
    m_registrationId(registrationId),
    m_streamId(streamId),
    m_imageList(new struct ImageList(new Image[0], 0)),
    m_isClosed(false)
{
}